

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_add_image(nk_draw_list *list,nk_image texture,nk_rect rect,nk_color color)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  nk_vec2 nVar12;
  nk_vec2 nVar13;
  nk_vec2 nVar14;
  nk_vec2 nVar15;
  nk_vec2 uv [2];
  nk_draw_list *list_local;
  float fStack_18;
  nk_color color_local;
  nk_rect rect_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x27fa,
                  "void nk_draw_list_add_image(struct nk_draw_list *, struct nk_image, struct nk_rect, struct nk_color)"
                 );
  }
  if (list != (nk_draw_list *)0x0) {
    nk_draw_list_push_image(list,texture.handle);
    iVar1 = nk_image_is_subimage(&texture);
    fStack_18 = rect.x;
    color_local = (nk_color)rect.y;
    rect_local.x = rect.w;
    rect_local.y = rect.h;
    if (iVar1 == 0) {
      nVar14 = nk_vec2(fStack_18,(float)color_local);
      nVar15 = nk_vec2(fStack_18 + rect_local.x,(float)color_local + rect_local.y);
      nVar12 = nk_vec2(0.0,0.0);
      nVar13 = nk_vec2(1.0,1.0);
      nk_draw_list_push_rect_uv(list,nVar14,nVar15,nVar12,nVar13,color);
    }
    else {
      uVar3 = (uint)texture.region[0];
      uVar4 = (uint)texture.w;
      uVar5 = (uint)texture.region[1];
      uVar6 = (uint)texture.h;
      uVar7 = (uint)texture.region[0];
      uVar10 = (uint)texture.region[2];
      uVar8 = (uint)texture.w;
      uVar9 = (uint)texture.region[1];
      uVar11 = (uint)texture.region[3];
      uVar2 = (uint)texture.h;
      nVar12 = nk_vec2(fStack_18,(float)color_local);
      nVar13 = nk_vec2(fStack_18 + rect_local.x,(float)color_local + rect_local.y);
      nVar14.y = (float)uVar5 / (float)uVar6;
      nVar14.x = (float)uVar3 / (float)uVar4;
      nVar15.y = (float)(uVar9 + uVar11) / (float)uVar2;
      nVar15.x = (float)(uVar7 + uVar10) / (float)uVar8;
      nk_draw_list_push_rect_uv(list,nVar12,nVar13,nVar14,nVar15,color);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_image(struct nk_draw_list *list, struct nk_image texture,
    struct nk_rect rect, struct nk_color color)
{
    NK_ASSERT(list);
    if (!list) return;
    /* push new command with given texture */
    nk_draw_list_push_image(list, texture.handle);
    if (nk_image_is_subimage(&texture)) {
        /* add region inside of the texture  */
        struct nk_vec2 uv[2];
        uv[0].x = (float)texture.region[0]/(float)texture.w;
        uv[0].y = (float)texture.region[1]/(float)texture.h;
        uv[1].x = (float)(texture.region[0] + texture.region[2])/(float)texture.w;
        uv[1].y = (float)(texture.region[1] + texture.region[3])/(float)texture.h;
        nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),  uv[0], uv[1], color);
    } else nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),
            nk_vec2(0.0f, 0.0f), nk_vec2(1.0f, 1.0f),color);
}